

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

const_iterator __thiscall toml::detail::location::line_begin(location *this)

{
  const_iterator __x;
  iterator_type iVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_38;
  char *local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_20;
  location *local_18;
  location *this_local;
  
  local_18 = this;
  local_30 = (char *)iter(this);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  ::reverse_iterator(&local_28,(iterator_type)local_30);
  __x = begin(this);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  ::reverse_iterator(&local_38,(iterator_type)__x._M_current);
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char>
            (&local_20,&local_28,(char *)&local_38);
  iVar1 = std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
          ::base(&local_20);
  return (const_iterator)iVar1._M_current;
}

Assistant:

const_iterator line_begin() const noexcept
    {
        using reverse_iterator = std::reverse_iterator<const_iterator>;
        return std::find(reverse_iterator(this->iter()),
                         reverse_iterator(this->begin()), '\n').base();
    }